

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O2

VarValue *
deqp::gles2::Functional::generateRandomVarValue
          (VarValue *__return_storage_ptr__,DataType type,Random *rnd,int samplerUnit)

{
  bool bVar1;
  uint uVar2;
  deUint32 dVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  long lVar6;
  float fVar7;
  
  uVar2 = glu::getDataTypeScalarSize(type);
  __return_storage_ptr__->type = type;
  if ((type - TYPE_FLOAT < 4) || (type - TYPE_FLOAT_MAT2 < 9 || type - TYPE_DOUBLE_MAT2 < 9)) {
    uVar4 = 0;
    uVar5 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar5 = 0;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      fVar7 = deRandom_getFloat(&rnd->m_rnd);
      *(float *)((long)&__return_storage_ptr__->val + uVar4 * 4) = fVar7 * 20.0 + -10.0;
    }
  }
  else if (type - TYPE_INT < 4) {
    uVar4 = 0;
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      dVar3 = deRandom_getUint32(&rnd->m_rnd);
      *(uint *)((long)&__return_storage_ptr__->val + uVar4 * 4) = dVar3 % 0x15 - 10;
    }
  }
  else if (type - TYPE_BOOL < 4) {
    uVar4 = 0;
    uVar5 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar5 = 0;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      bVar1 = de::Random::getBool(rnd);
      (__return_storage_ptr__->val).boolV[uVar4] = bVar1;
    }
  }
  else if (type - TYPE_SAMPLER_1D < 0x1e) {
    (__return_storage_ptr__->val).samplerV.unit = samplerUnit;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      fVar7 = deRandom_getFloat(&rnd->m_rnd);
      *(float *)((long)&__return_storage_ptr__->val + lVar6 * 4 + 4) = fVar7 + 0.0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static VarValue generateRandomVarValue (const glu::DataType type, Random& rnd, int samplerUnit = -1 /* Used if type is a sampler type. \note Samplers' unit numbers are not randomized. */)
{
	const int	numElems = glu::getDataTypeScalarSize(type);
	VarValue	result;
	result.type = type;

	DE_ASSERT((samplerUnit >= 0) == (glu::isDataTypeSampler(type)));

	if (glu::isDataTypeFloatOrVec(type) || glu::isDataTypeMatrix(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.floatV[i] = rnd.getFloat(-10.0f, 10.0f);
	}
	else if (glu::isDataTypeIntOrIVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.intV[i] = rnd.getInt(-10, 10);
	}
	else if (glu::isDataTypeBoolOrBVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.boolV[i] = rnd.getBool();
	}
	else if (glu::isDataTypeSampler(type))
	{
		result.val.samplerV.unit = samplerUnit;

		for (int i = 0; i < 4; i++)
			result.val.samplerV.fillColor[i] = rnd.getFloat(0.0f, 1.0f);
	}
	else
		DE_ASSERT(false);

	return result;
}